

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_context_enumerate_devices__pulse
                    (ma_context *pContext,ma_enum_devices_callback_proc callback,void *pUserData)

{
  int iVar1;
  ma_pa_mainloop *pMainLoop_00;
  long lVar2;
  ma_pa_operation *pmVar3;
  ma_pa_context_state_t state;
  int error;
  ma_pa_context *pPulseContext;
  ma_pa_mainloop_api *pAPI;
  ma_pa_mainloop *pMainLoop;
  ma_pa_operation *pOP;
  ma_context_enumerate_devices_callback_data__pulse callbackData;
  ma_result result;
  void *pUserData_local;
  ma_enum_devices_callback_proc callback_local;
  ma_context *pContext_local;
  
  callbackData._28_4_ = 0;
  if (pContext == (ma_context *)0x0) {
    __assert_fail("pContext != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x4a9d,
                  "ma_result ma_context_enumerate_devices__pulse(ma_context *, ma_enum_devices_callback_proc, void *)"
                 );
  }
  if (callback == (ma_enum_devices_callback_proc)0x0) {
    __assert_fail("callback != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x4a9e,
                  "ma_result ma_context_enumerate_devices__pulse(ma_context *, ma_enum_devices_callback_proc, void *)"
                 );
  }
  callbackData.pUserData._0_4_ = 0;
  pOP = (ma_pa_operation *)pContext;
  callbackData.pContext = (ma_context *)callback;
  callbackData.callback = (ma_enum_devices_callback_proc)pUserData;
  pMainLoop_00 = (ma_pa_mainloop *)(*(pContext->field_21).alsa.snd_pcm_open)();
  if (pMainLoop_00 == (ma_pa_mainloop *)0x0) {
    pContext_local._4_4_ = -300;
  }
  else {
    lVar2 = (*(pContext->field_21).alsa.snd_pcm_hw_params_sizeof)(pMainLoop_00);
    if (lVar2 == 0) {
      (*(pContext->field_21).alsa.snd_pcm_close)(pMainLoop_00);
      pContext_local._4_4_ = -300;
    }
    else {
      lVar2 = (*(pContext->field_21).alsa.snd_pcm_hw_params_set_format_first)
                        (lVar2,(pContext->field_21).alsa.snd_pcm_mmap_commit);
      if (lVar2 == 0) {
        (*(pContext->field_21).alsa.snd_pcm_close)(pMainLoop_00);
        pContext_local._4_4_ = -300;
      }
      else {
        iVar1 = (*(pContext->field_21).alsa.snd_pcm_hw_params_set_channels_near)
                          (lVar2,(pContext->field_21).alsa.snd_pcm_recover,
                           (ulong)((pContext->field_21).pulse.tryAutoSpawn == 0),0);
        if (iVar1 == 0) {
          do {
            while( true ) {
              iVar1 = (*(pContext->field_21).alsa.snd_pcm_hw_params_set_buffer_size_near)(lVar2);
              if (iVar1 == 4) {
                if ((int)callbackData.pUserData == 0) {
                  pmVar3 = (ma_pa_operation *)
                           (*(pContext->field_21).alsa.snd_pcm_hw_params_set_periods_near)
                                     (lVar2,ma_context_enumerate_devices_sink_callback__pulse,&pOP);
                  if (pmVar3 == (ma_pa_operation *)0x0) {
                    callbackData._28_4_ = 0xffffffff;
                    goto LAB_0011744f;
                  }
                  callbackData._28_4_ = ma_wait_for_operation__pulse(pContext,pMainLoop_00,pmVar3);
                  (*(pContext->field_21).alsa.snd_pcm_hw_params_get_channels_min)(pmVar3);
                  if (callbackData._28_4_ != 0) goto LAB_0011744f;
                }
                if ((int)callbackData.pUserData == 0) {
                  pmVar3 = (ma_pa_operation *)
                           (*(pContext->field_21).alsa.snd_pcm_hw_params_set_access)
                                     (lVar2,ma_context_enumerate_devices_source_callback__pulse,&pOP
                                     );
                  if (pmVar3 == (ma_pa_operation *)0x0) {
                    callbackData._28_4_ = 0xffffffff;
                  }
                  else {
                    callbackData._28_4_ = ma_wait_for_operation__pulse(pContext,pMainLoop_00,pmVar3)
                    ;
                    (*(pContext->field_21).alsa.snd_pcm_hw_params_get_channels_min)(pmVar3);
                  }
                }
                goto LAB_0011744f;
              }
              if (((iVar1 == 1) || (iVar1 == 2)) || (iVar1 == 3)) break;
              if (((iVar1 == 0) || (iVar1 == 5)) || (iVar1 == 6)) goto LAB_0011744f;
            }
            iVar1 = (*(pContext->field_21).alsa.snd_pcm_hw_params_any)(pMainLoop_00,1,0);
          } while (-1 < iVar1);
          callbackData._28_4_ = ma_result_from_pulse(iVar1);
LAB_0011744f:
          (*(pContext->field_21).alsa.snd_pcm_hw_params_set_rate_resample)(lVar2);
          (*(pContext->field_21).alsa.snd_pcm_hw_params_get_format_mask)(lVar2);
          (*(pContext->field_21).alsa.snd_pcm_close)(pMainLoop_00);
          pContext_local._4_4_ = callbackData._28_4_;
        }
        else {
          (*(pContext->field_21).alsa.snd_pcm_hw_params_get_format_mask)(lVar2);
          (*(pContext->field_21).alsa.snd_pcm_close)(pMainLoop_00);
          pContext_local._4_4_ = ma_result_from_pulse(iVar1);
        }
      }
    }
  }
  return pContext_local._4_4_;
}

Assistant:

static ma_result ma_context_enumerate_devices__pulse(ma_context* pContext, ma_enum_devices_callback_proc callback, void* pUserData)
{
    ma_result result = MA_SUCCESS;
    ma_context_enumerate_devices_callback_data__pulse callbackData;
    ma_pa_operation* pOP = NULL;
    ma_pa_mainloop* pMainLoop;
    ma_pa_mainloop_api* pAPI;
    ma_pa_context* pPulseContext;
    int error;

    MA_ASSERT(pContext != NULL);
    MA_ASSERT(callback != NULL);

    callbackData.pContext = pContext;
    callbackData.callback = callback;
    callbackData.pUserData = pUserData;
    callbackData.isTerminated = MA_FALSE;

    pMainLoop = ((ma_pa_mainloop_new_proc)pContext->pulse.pa_mainloop_new)();
    if (pMainLoop == NULL) {
        return MA_FAILED_TO_INIT_BACKEND;
    }

    pAPI = ((ma_pa_mainloop_get_api_proc)pContext->pulse.pa_mainloop_get_api)(pMainLoop);
    if (pAPI == NULL) {
        ((ma_pa_mainloop_free_proc)pContext->pulse.pa_mainloop_free)(pMainLoop);
        return MA_FAILED_TO_INIT_BACKEND;
    }

    pPulseContext = ((ma_pa_context_new_proc)pContext->pulse.pa_context_new)(pAPI, pContext->pulse.pApplicationName);
    if (pPulseContext == NULL) {
        ((ma_pa_mainloop_free_proc)pContext->pulse.pa_mainloop_free)(pMainLoop);
        return MA_FAILED_TO_INIT_BACKEND;
    }

    error = ((ma_pa_context_connect_proc)pContext->pulse.pa_context_connect)(pPulseContext, pContext->pulse.pServerName, (pContext->pulse.tryAutoSpawn) ? 0 : MA_PA_CONTEXT_NOAUTOSPAWN, NULL);
    if (error != MA_PA_OK) {
        ((ma_pa_context_unref_proc)pContext->pulse.pa_context_unref)(pPulseContext);
        ((ma_pa_mainloop_free_proc)pContext->pulse.pa_mainloop_free)(pMainLoop);
        return ma_result_from_pulse(error);
    }

    for (;;) {
        ma_pa_context_state_t state = ((ma_pa_context_get_state_proc)pContext->pulse.pa_context_get_state)(pPulseContext);
        if (state == MA_PA_CONTEXT_READY) {
            break;  /* Success. */
        }
        if (state == MA_PA_CONTEXT_CONNECTING || state == MA_PA_CONTEXT_AUTHORIZING || state == MA_PA_CONTEXT_SETTING_NAME) {
            error = ((ma_pa_mainloop_iterate_proc)pContext->pulse.pa_mainloop_iterate)(pMainLoop, 1, NULL);
            if (error < 0) {
                result = ma_result_from_pulse(error);
                goto done;
            }

#ifdef MA_DEBUG_OUTPUT
            printf("[PulseAudio] pa_context_get_state() returned %d. Waiting.\n", state);
#endif
            continue;   /* Keep trying. */
        }
        if (state == MA_PA_CONTEXT_UNCONNECTED || state == MA_PA_CONTEXT_FAILED || state == MA_PA_CONTEXT_TERMINATED) {
#ifdef MA_DEBUG_OUTPUT
            printf("[PulseAudio] pa_context_get_state() returned %d. Failed.\n", state);
#endif
            goto done;  /* Failed. */
        }
    }


    /* Playback. */
    if (!callbackData.isTerminated) {
        pOP = ((ma_pa_context_get_sink_info_list_proc)pContext->pulse.pa_context_get_sink_info_list)(pPulseContext, ma_context_enumerate_devices_sink_callback__pulse, &callbackData);
        if (pOP == NULL) {
            result = MA_ERROR;
            goto done;
        }

        result = ma_wait_for_operation__pulse(pContext, pMainLoop, pOP);
        ((ma_pa_operation_unref_proc)pContext->pulse.pa_operation_unref)(pOP);
        if (result != MA_SUCCESS) {
            goto done;
        }
    }


    /* Capture. */
    if (!callbackData.isTerminated) {
        pOP = ((ma_pa_context_get_source_info_list_proc)pContext->pulse.pa_context_get_source_info_list)(pPulseContext, ma_context_enumerate_devices_source_callback__pulse, &callbackData);
        if (pOP == NULL) {
            result = MA_ERROR;
            goto done;
        }

        result = ma_wait_for_operation__pulse(pContext, pMainLoop, pOP);
        ((ma_pa_operation_unref_proc)pContext->pulse.pa_operation_unref)(pOP);
        if (result != MA_SUCCESS) {
            goto done;
        }
    }

done:
    ((ma_pa_context_disconnect_proc)pContext->pulse.pa_context_disconnect)(pPulseContext);
    ((ma_pa_context_unref_proc)pContext->pulse.pa_context_unref)(pPulseContext);
    ((ma_pa_mainloop_free_proc)pContext->pulse.pa_mainloop_free)(pMainLoop);
    return result;
}